

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QAction*,QPointer<QAction>>
                    (QList<QAction_*> *vector,QPointer<QAction> *u,qsizetype from)

{
  long lVar1;
  ulong uVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  QObject *pQVar6;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar2 = (vector->d).size;
  if ((ulong)from < uVar2) {
    pDVar3 = (u->wp).d;
    lVar5 = from * 8 + -8;
    do {
      lVar1 = uVar2 * -8 + lVar5;
      if (lVar1 == -8) goto LAB_00470f9b;
      lVar4 = lVar5 + 8;
      if (pDVar3 == (Data *)0x0) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = (u->wp).value;
        if (*(int *)(pDVar3 + 4) == 0) {
          pQVar6 = (QObject *)0x0;
        }
      }
      lVar5 = lVar5 + 8;
    } while (pQVar6 != *(QObject **)((long)(vector->d).ptr + lVar4));
    lVar5 = lVar5 >> 3;
LAB_00470f9b:
    if (lVar1 != -8) {
      return lVar5;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}